

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TIA.hpp
# Opt level: O2

void __thiscall
Atari2600::TIA::Player::enqueue_pixels(Player *this,int start,int end,int from_horizontal_counter)

{
  int iVar1;
  
  iVar1 = this->queue_write_pointer_;
  this->queue_[iVar1].start = start;
  this->queue_[iVar1].end = end;
  this->queue_[iVar1].pixel_position = this->pixel_position;
  this->queue_[iVar1].adder = this->adder;
  this->queue_[iVar1].reverse_mask = this->reverse_mask;
  this->queue_write_pointer_ = iVar1 + 1U & 3;
  skip_pixels(this,end - start,from_horizontal_counter);
  return;
}

Assistant:

void enqueue_pixels(const int start, const int end, int from_horizontal_counter) {
				queue_[queue_write_pointer_].start = start;
				queue_[queue_write_pointer_].end = end;
				queue_[queue_write_pointer_].pixel_position = pixel_position;
				queue_[queue_write_pointer_].adder = adder;
				queue_[queue_write_pointer_].reverse_mask = reverse_mask;
				queue_write_pointer_ = (queue_write_pointer_ + 1)&3;
				skip_pixels(end - start, from_horizontal_counter);
			}